

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall sznet::net::Connector::startInLoop(Connector *this)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  SourceFile file;
  Logger local_ff0;
  undefined1 local_20 [12];
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state != kDisconnected) {
    __assert_fail("m_state == kDisconnected",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                  ,0x2c,"void sznet::net::Connector::startInLoop()");
  }
  if (this->m_connect == true) {
    connect(this,in_ESI,__addr,in_ECX);
    return;
  }
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_20,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_20._0_8_;
    file.m_size = local_20._8_4_;
    Logger::Logger(&local_ff0,file,0x33,DEBUG,"startInLoop");
    LogStream::operator<<(&local_ff0.m_impl.m_stream,"do not connect");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void Connector::startInLoop()
{
	m_loop->assertInLoopThread();
	assert(m_state == kDisconnected);
	if (m_connect)
	{
		connect();
	}
	else
	{
		LOG_DEBUG << "do not connect";
	}
}